

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.hpp
# Opt level: O1

Instruction *
Instruction::createArithmetic
          (Instruction *__return_storage_ptr__,int id,char type,int dest,int src1,int src2)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Instruction *pIVar10;
  InstructionType IVar11;
  size_type __n;
  long lVar12;
  Instruction *pIVar13;
  undefined8 *puVar14;
  undefined7 in_register_00000011;
  undefined8 *extraout_RDX;
  Instruction *pIVar15;
  undefined4 in_register_00000034;
  undefined8 *puVar16;
  Instruction *this;
  
  puVar16 = (undefined8 *)CONCAT44(in_register_00000034,id);
  __return_storage_ptr__->offset = 0;
  __return_storage_ptr__->issued_cycle = 0;
  __return_storage_ptr__->executed_cycle = 0;
  __return_storage_ptr__->written_cycle = 0;
  __return_storage_ptr__->src2 = 0;
  __return_storage_ptr__->addr = 0;
  __return_storage_ptr__->condition = 0;
  __return_storage_ptr__->src = 0;
  __return_storage_ptr__->type = JUMP;
  __return_storage_ptr__->id = 0;
  __return_storage_ptr__->dest = 0;
  __return_storage_ptr__->src1 = 0;
  __return_storage_ptr__->issued_cycle = -1;
  __return_storage_ptr__->executed_cycle = -1;
  __return_storage_ptr__->written_cycle = -1;
  iVar3 = (int)CONCAT71(in_register_00000011,type);
  switch(iVar3) {
  case 0x4a:
    IVar11 = JUMP;
    break;
  case 0x4b:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
switchD_00105185_caseD_4b:
    this = (Instruction *)(ulong)(byte)type;
    createArithmetic(this);
    __n = std::vector<Instruction,_std::allocator<Instruction>_>::_M_check_len
                    ((vector<Instruction,_std::allocator<Instruction>_> *)this,1,
                     "vector::_M_realloc_insert");
    puVar1 = *(undefined8 **)this;
    puVar2 = *(undefined8 **)&this->dest;
    lVar12 = (long)puVar16 - (long)puVar1 >> 4;
    if (__n == 0) {
      pIVar13 = (Instruction *)0x0;
    }
    else {
      pIVar13 = __gnu_cxx::new_allocator<Instruction>::allocate
                          ((new_allocator<Instruction> *)this,__n,(void *)0x0);
    }
    uVar4 = *extraout_RDX;
    uVar5 = extraout_RDX[1];
    uVar6 = extraout_RDX[2];
    uVar7 = extraout_RDX[3];
    uVar8 = extraout_RDX[5];
    *(undefined8 *)(&pIVar13->offset + lVar12 * 4) = extraout_RDX[4];
    *(undefined8 *)(&pIVar13->offset + lVar12 * 4 + 2) = uVar8;
    *(undefined8 *)(&pIVar13->src2 + lVar12 * 4) = uVar6;
    *(undefined8 *)(&pIVar13->src2 + lVar12 * 4 + 2) = uVar7;
    *(undefined8 *)(&pIVar13->type + lVar12 * 4) = uVar4;
    *(undefined8 *)(&pIVar13->type + lVar12 * 4 + 2) = uVar5;
    pIVar15 = pIVar13;
    for (puVar14 = puVar1; puVar14 != puVar16; puVar14 = puVar14 + 6) {
      uVar4 = *puVar14;
      uVar5 = puVar14[1];
      uVar6 = puVar14[2];
      uVar7 = puVar14[3];
      uVar8 = puVar14[4];
      uVar9 = puVar14[5];
      pIVar15->offset = (int)uVar8;
      pIVar15->issued_cycle = (int)((ulong)uVar8 >> 0x20);
      pIVar15->executed_cycle = (int)uVar9;
      pIVar15->written_cycle = (int)((ulong)uVar9 >> 0x20);
      pIVar15->src2 = (int)uVar6;
      pIVar15->addr = (int)((ulong)uVar6 >> 0x20);
      pIVar15->condition = (int)uVar7;
      pIVar15->src = (int)((ulong)uVar7 >> 0x20);
      pIVar15->type = (int)uVar4;
      pIVar15->id = (int)((ulong)uVar4 >> 0x20);
      pIVar15->dest = (int)uVar5;
      pIVar15->src1 = (int)((ulong)uVar5 >> 0x20);
      pIVar15 = pIVar15 + 1;
    }
    for (; pIVar10 = pIVar15 + 1, puVar2 != puVar16; puVar16 = puVar16 + 6) {
      uVar4 = *puVar16;
      uVar5 = puVar16[1];
      uVar6 = puVar16[2];
      uVar7 = puVar16[3];
      uVar8 = puVar16[4];
      uVar9 = puVar16[5];
      pIVar15[1].offset = (int)uVar8;
      pIVar15[1].issued_cycle = (int)((ulong)uVar8 >> 0x20);
      pIVar15[1].executed_cycle = (int)uVar9;
      pIVar15[1].written_cycle = (int)((ulong)uVar9 >> 0x20);
      pIVar15[1].src2 = (int)uVar6;
      pIVar15[1].addr = (int)((ulong)uVar6 >> 0x20);
      pIVar15[1].condition = (int)uVar7;
      pIVar15[1].src = (int)((ulong)uVar7 >> 0x20);
      pIVar10->type = (int)uVar4;
      pIVar10->id = (int)((ulong)uVar4 >> 0x20);
      pIVar15[1].dest = (int)uVar5;
      pIVar15[1].src1 = (int)((ulong)uVar5 >> 0x20);
      pIVar15 = pIVar10;
    }
    if (puVar1 != (undefined8 *)0x0) {
      operator_delete(puVar1,*(long *)&this->src2 - (long)puVar1);
    }
    *(Instruction **)this = pIVar13;
    *(Instruction **)&this->dest = pIVar10;
    *(Instruction **)&this->src2 = pIVar13 + __n;
    return pIVar13 + __n;
  case 0x4c:
    IVar11 = LOAD;
    break;
  case 0x4d:
    IVar11 = MUL;
    break;
  case 0x53:
    IVar11 = SUB;
    break;
  default:
    if (iVar3 == 0x41) {
      IVar11 = ADD;
    }
    else {
      if (iVar3 != 0x44) goto switchD_00105185_caseD_4b;
      IVar11 = DIV;
    }
  }
  __return_storage_ptr__->type = IVar11;
  __return_storage_ptr__->id = id;
  __return_storage_ptr__->dest = dest;
  __return_storage_ptr__->src1 = src1;
  __return_storage_ptr__->src2 = src2;
  return __return_storage_ptr__;
}

Assistant:

static Instruction createArithmetic(int id, char type, int dest, int src1, int src2) {
        Instruction instruction{};
        instruction.type = getType(type);
        instruction.id = id;
        instruction.dest = dest;
        instruction.src1 = src1;
        instruction.src2 = src2;

        return instruction;
    }